

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_udp_send(uv_udp_send_t *req,uv_udp_t *handle,uv_buf_t *bufs,uint nbufs,sockaddr *addr,
               uv_udp_send_cb send_cb)

{
  uint local_44;
  uint addrlen;
  uv_udp_send_cb send_cb_local;
  sockaddr *addr_local;
  uint nbufs_local;
  uv_buf_t *bufs_local;
  uv_udp_t *handle_local;
  uv_udp_send_t *req_local;
  
  if (handle->type == UV_UDP) {
    if (addr->sa_family == 2) {
      local_44 = 0x10;
    }
    else {
      if (addr->sa_family != 10) {
        return -0x16;
      }
      local_44 = 0x1c;
    }
    req_local._4_4_ = uv__udp_send(req,handle,bufs,nbufs,addr,local_44,send_cb);
  }
  else {
    req_local._4_4_ = -0x16;
  }
  return req_local._4_4_;
}

Assistant:

int uv_udp_send(uv_udp_send_t* req,
                uv_udp_t* handle,
                const uv_buf_t bufs[],
                unsigned int nbufs,
                const struct sockaddr* addr,
                uv_udp_send_cb send_cb) {
  unsigned int addrlen;

  if (handle->type != UV_UDP)
    return UV_EINVAL;

  if (addr->sa_family == AF_INET)
    addrlen = sizeof(struct sockaddr_in);
  else if (addr->sa_family == AF_INET6)
    addrlen = sizeof(struct sockaddr_in6);
  else
    return UV_EINVAL;

  return uv__udp_send(req, handle, bufs, nbufs, addr, addrlen, send_cb);
}